

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

void __thiscall
google::protobuf::EnumValueDescriptor::CopyTo
          (EnumValueDescriptor *this,EnumValueDescriptorProto *proto)

{
  HasBits<1> *pHVar1;
  uint uVar2;
  pointer pcVar3;
  size_type sVar4;
  FeatureSet *from;
  EnumValueOptions *pEVar5;
  EnumValueOptions *pEVar6;
  FeatureSet *pFVar7;
  Arena *pAVar8;
  string_view value;
  
  pcVar3 = (this->all_names_->_M_dataplus)._M_p;
  sVar4 = this->all_names_->_M_string_length;
  (proto->field_0)._impl_._has_bits_.has_bits_[0] =
       (proto->field_0)._impl_._has_bits_.has_bits_[0] | 1;
  pAVar8 = (Arena *)(proto->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)pAVar8 & 1) != 0) {
    pAVar8 = *(Arena **)((ulong)pAVar8 & 0xfffffffffffffffe);
  }
  value._M_str = pcVar3;
  value._M_len = sVar4;
  internal::ArenaStringPtr::Set(&(proto->field_0)._impl_.name_,value,pAVar8);
  (proto->field_0)._impl_.number_ = this->number_;
  uVar2 = *(uint *)&proto->field_0;
  (proto->field_0)._impl_._has_bits_.has_bits_[0] = uVar2 | 4;
  pEVar6 = this->options_;
  if (pEVar6 != (EnumValueOptions *)_EnumValueOptions_default_instance_) {
    (proto->field_0)._impl_._has_bits_.has_bits_[0] = uVar2 | 6;
    if ((proto->field_0)._impl_.options_ == (EnumValueOptions *)0x0) {
      pAVar8 = (Arena *)(proto->super_Message).super_MessageLite._internal_metadata_.ptr_;
      if (((ulong)pAVar8 & 1) != 0) {
        pAVar8 = *(Arena **)((ulong)pAVar8 & 0xfffffffffffffffe);
      }
      pEVar5 = (EnumValueOptions *)
               Arena::DefaultConstruct<google::protobuf::EnumValueOptions>(pAVar8);
      (proto->field_0)._impl_.options_ = pEVar5;
    }
    EnumValueOptions::CopyFrom((proto->field_0)._impl_.options_,pEVar6);
  }
  from = this->proto_features_;
  if (from != (FeatureSet *)_FeatureSet_default_instance_) {
    *(byte *)&proto->field_0 = *(byte *)&proto->field_0 | 2;
    if ((proto->field_0)._impl_.options_ == (EnumValueOptions *)0x0) {
      pAVar8 = (Arena *)(proto->super_Message).super_MessageLite._internal_metadata_.ptr_;
      if (((ulong)pAVar8 & 1) != 0) {
        pAVar8 = *(Arena **)((ulong)pAVar8 & 0xfffffffffffffffe);
      }
      pEVar6 = (EnumValueOptions *)
               Arena::DefaultConstruct<google::protobuf::EnumValueOptions>(pAVar8);
      (proto->field_0)._impl_.options_ = pEVar6;
    }
    pEVar6 = (proto->field_0)._impl_.options_;
    pHVar1 = &(pEVar6->field_0)._impl_._has_bits_;
    pHVar1->has_bits_[0] = pHVar1->has_bits_[0] | 1;
    if ((pEVar6->field_0)._impl_.features_ == (FeatureSet *)0x0) {
      pAVar8 = (Arena *)(pEVar6->super_Message).super_MessageLite._internal_metadata_.ptr_;
      if (((ulong)pAVar8 & 1) != 0) {
        pAVar8 = *(Arena **)((ulong)pAVar8 & 0xfffffffffffffffe);
      }
      pFVar7 = (FeatureSet *)Arena::DefaultConstruct<google::protobuf::FeatureSet>(pAVar8);
      (pEVar6->field_0)._impl_.features_ = pFVar7;
    }
    FeatureSet::CopyFrom((pEVar6->field_0)._impl_.features_,from);
    return;
  }
  return;
}

Assistant:

void EnumValueDescriptor::CopyTo(EnumValueDescriptorProto* proto) const {
  proto->set_name(name());
  proto->set_number(number());

  if (&options() != &EnumValueOptions::default_instance()) {
    *proto->mutable_options() = options();
  }
  RestoreFeaturesToOptions(proto_features_, proto);
}